

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtIntersectOne(word *pOut,int fComp,word *pIn,int fComp0,int nWords)

{
  long lVar1;
  ulong *puVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  
  uVar4 = 0;
  if (0 < fComp0) {
    uVar4 = (ulong)(uint)fComp0;
  }
  if ((int)pIn == 0) {
    uVar3 = 0;
    do {
      if (uVar4 == uVar3) {
        return 0;
      }
      puVar2 = pOut + uVar3;
      lVar1 = uVar3 * 8;
      uVar3 = uVar3 + 1;
    } while ((*(ulong *)(CONCAT44(in_register_00000034,fComp) + lVar1) & *puVar2) == 0);
  }
  else {
    uVar3 = 0;
    do {
      if (uVar4 == uVar3) {
        return 0;
      }
      lVar1 = uVar3 * 8;
      puVar2 = pOut + uVar3;
      uVar3 = uVar3 + 1;
    } while ((*puVar2 & ~*(ulong *)(CONCAT44(in_register_00000034,fComp) + lVar1)) == 0);
  }
  return 1;
}

Assistant:

static inline int Abc_TtIntersectOne( word * pOut, int fComp, word * pIn, int fComp0, int nWords )
{
    int w;
    if ( fComp0 )
    {
        if ( fComp )
        {
            for ( w = 0; w < nWords; w++ )
                if ( ~pIn[w] & ~pOut[w] )
                    return 1;
        }
        else
        {
            for ( w = 0; w < nWords; w++ )
                if ( ~pIn[w] & pOut[w] )
                    return 1;
        }
    }
    else
    {
        if ( fComp )
        {
            for ( w = 0; w < nWords; w++ )
                if ( pIn[w] & ~pOut[w] )
                    return 1;
        }
        else
        {
            for ( w = 0; w < nWords; w++ )
                if ( pIn[w] & pOut[w] )
                    return 1;
        }
    }
    return 0;
}